

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PosixPath.cpp
# Opt level: O1

PosixPath * __thiscall PosixPath::GetFolder(PosixPath *__return_storage_ptr__,PosixPath *this)

{
  StringList *this_00;
  
  this_00 = &__return_storage_ptr__->mPathComponents;
  (__return_storage_ptr__->mPathComponents).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
  (__return_storage_ptr__->mPathComponents).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
  (__return_storage_ptr__->mPathComponents).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  __return_storage_ptr__->mIsAbsolute = false;
  __return_storage_ptr__->mIsAbsolute = this->mIsAbsolute;
  if (__return_storage_ptr__ != this) {
    std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_assign_dispatch<std::_List_const_iterator<std::__cxx11::string>>
              ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               (this->mPathComponents).
               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl._M_node.super__List_node_base._M_next,&this->mPathComponents);
  }
  if ((__return_storage_ptr__->mPathComponents).
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node._M_size != 0) {
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(this_00,(__return_storage_ptr__->mPathComponents).
                       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl._M_node.super__List_node_base._M_prev);
  }
  return __return_storage_ptr__;
}

Assistant:

PosixPath PosixPath::GetFolder() const
{
	PosixPath newPath;
    
	// in edge case of "/" , will return the same path. in empty relative, will enter empty relative
	// in all other cases will return a url with one less component from the component list
    
	newPath.SetIsAbsolute(mIsAbsolute);
	newPath.mPathComponents = mPathComponents;
	newPath.PopPathComponent();
	return newPath;
}